

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O3

void __thiscall
slang::parsing::Preprocessor::applyPragma
          (Preprocessor *this,PragmaDirectiveSyntax *pragma,
          SmallVectorBase<slang::parsing::Token> *skippedTokens)

{
  int iVar1;
  size_t __n;
  Diagnostic *this_00;
  int *__s1;
  size_type __rlen;
  string_view arg;
  SourceRange range;
  
  arg = Token::valueText(&pragma->name);
  __s1 = (int *)arg._M_str;
  __n = arg._M_len;
  switch(__n) {
  case 4:
    iVar1 = bcmp(__s1,"once",__n);
    if (iVar1 == 0) {
      applyOncePragma(this,pragma);
      return;
    }
    break;
  case 5:
    iVar1 = bcmp(__s1,"reset",__n);
    if (iVar1 == 0) {
      applyResetPragma(this,pragma);
      return;
    }
    break;
  case 7:
    if (*(int *)((long)__s1 + 3) == 0x74636574 && *__s1 == 0x746f7270) {
      applyProtectPragma(this,pragma,skippedTokens);
      return;
    }
    break;
  case 8:
    iVar1 = bcmp(__s1,"resetall",__n);
    if (iVar1 == 0) {
      ensurePragmaArgs(this,pragma,0);
      this->protectEncryptDepth = 0;
      this->protectDecryptDepth = 0;
      this->protectLineLength = 0;
      this->protectBytes = 0;
      this->protectEncoding = Raw;
      return;
    }
    break;
  case 10:
    iVar1 = bcmp(__s1,"diagnostic",__n);
    if (iVar1 == 0) {
      applyDiagnosticPragma(this,pragma);
      return;
    }
  }
  range = Token::range(&pragma->name);
  this_00 = addDiag(this,(DiagCode)0x2b0004,range);
  Diagnostic::operator<<(this_00,arg);
  return;
}

Assistant:

void Preprocessor::applyPragma(const PragmaDirectiveSyntax& pragma,
                               SmallVectorBase<Token>& skippedTokens) {
    std::string_view name = pragma.name.valueText();
    if (name == "protect") {
        applyProtectPragma(pragma, skippedTokens);
        return;
    }

    if (name == "reset") {
        applyResetPragma(pragma);
        return;
    }

    if (name == "resetall") {
        applyResetAllPragma(pragma);
        return;
    }

    if (name == "once") {
        applyOncePragma(pragma);
        return;
    }

    if (name == "diagnostic") {
        applyDiagnosticPragma(pragma);
        return;
    }

    // Otherwise, if the pragma is unknown warn and ignore.
    addDiag(diag::UnknownPragma, pragma.name.range()) << name;
}